

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O0

ssize_t xread(file_stream *strm,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  ulong in_RDX;
  void *in_RSI;
  int *in_RDI;
  ssize_t res;
  size_t orig_count;
  char *p;
  size_t local_50;
  void *local_28;
  ulong local_20;
  
  local_28 = in_RSI;
  local_20 = in_RDX;
  while (local_20 != 0) {
    if (local_20 < 0x80000000) {
      local_50 = local_20;
    }
    else {
      local_50 = 0x7fffffff;
    }
    sVar1 = read(*in_RDI,local_28,local_50);
    if (sVar1 == 0) break;
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      if ((*piVar2 != 0xb) && (piVar2 = __errno_location(), *piVar2 != 4)) {
        msg_errno("Error reading from %s",*(undefined8 *)(in_RDI + 2));
        return -1;
      }
    }
    else {
      local_28 = (void *)(sVar1 + (long)local_28);
      local_20 = local_20 - sVar1;
    }
  }
  return in_RDX - local_20;
}

Assistant:

ssize_t
xread(struct file_stream *strm, void *buf, size_t count)
{
	char *p = buf;
	size_t orig_count = count;

	while (count != 0) {
		ssize_t res = read(strm->fd, p, MIN(count, INT_MAX));
		if (res == 0)
			break;
		if (res < 0) {
			if (errno == EAGAIN || errno == EINTR)
				continue;
			msg_errno("Error reading from %"TS, strm->name);
			return -1;
		}
		p += res;
		count -= res;
	}
	return orig_count - count;
}